

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O0

void google::protobuf::compiler::java::WriteDeprecatedJavadoc
               (Printer *printer,FieldDescriptor *field,FieldAccessorType type)

{
  bool bVar1;
  FileOptions_OptimizeMode FVar2;
  FieldOptions *this;
  FileDescriptor *this_00;
  FileOptions *this_01;
  FieldAccessorType type_local;
  FieldDescriptor *field_local;
  Printer *printer_local;
  
  this = FieldDescriptor::options(field);
  bVar1 = FieldOptions::deprecated(this);
  if (bVar1) {
    this_00 = FieldDescriptor::file(field);
    this_01 = FileDescriptor::options(this_00);
    FVar2 = FileOptions::optimize_for(this_01);
    if ((FVar2 != FileOptions_OptimizeMode_LITE_RUNTIME) || ((type != SETTER && (type != CLEARER))))
    {
      io::Printer::Print<>(printer," * @deprecated\n");
    }
  }
  return;
}

Assistant:

void WriteDeprecatedJavadoc(io::Printer* printer, const FieldDescriptor* field,
                            const FieldAccessorType type) {
  if (!field->options().deprecated()) {
    return;
  }

  // Lite codegen does not annotate set & clear methods with @Deprecated.
  if (field->file()->options().optimize_for() == FileOptions::LITE_RUNTIME &&
      (type == SETTER || type == CLEARER)) {
    return;
  }

  printer->Print(" * @deprecated\n");
}